

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

void __thiscall OrgData::PlayData(OrgData *this)

{
  char cVar1;
  int local_14;
  int i;
  OrgData *this_local;
  
  if ((bFadeout) && (Volume != 0)) {
    Volume = Volume + -2;
  }
  if (Volume < 0) {
    Volume = 0;
  }
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    cVar1 = (char)local_14;
    if ((np[local_14] != (NOTELIST *)0x0) && (PlayPos == np[local_14]->x)) {
      if (((g_mute[local_14] & 1U) == 0) && (np[local_14]->y != 0xff)) {
        PlayOrganObject(np[local_14]->y,-1,cVar1,(ulong)(this->info).tdata[local_14].freq);
        now_leng[local_14] = (ulong)np[local_14]->length;
      }
      if (np[local_14]->pan != 0xff) {
        ChangeOrganPan(np[local_14]->y,np[local_14]->pan,cVar1);
      }
      if (np[local_14]->volume != 0xff) {
        TrackVol[local_14] = (uint)np[local_14]->volume;
      }
      np[local_14] = np[local_14]->to;
    }
    if (now_leng[local_14] == 0) {
      PlayOrganObject('\0',2,cVar1,(ulong)(this->info).tdata[local_14].freq);
    }
    if (0 < now_leng[local_14]) {
      now_leng[local_14] = now_leng[local_14] + -1;
    }
    if (np[local_14] != (NOTELIST *)0x0) {
      ChangeOrganVolume((uint)np[local_14]->y,(long)((TrackVol[local_14] * Volume) / 0x7f),cVar1);
    }
  }
  for (local_14 = 8; local_14 < 0x10; local_14 = local_14 + 1) {
    cVar1 = (char)local_14;
    if ((np[local_14] != (NOTELIST *)0x0) && (PlayPos == np[local_14]->x)) {
      if ((np[local_14]->y != 0xff) && ((g_mute[local_14] & 1U) == 0)) {
        PlayDramObject(np[local_14]->y,1,cVar1 + -8);
      }
      if (np[local_14]->pan != 0xff) {
        ChangeDramPan(np[local_14]->pan,cVar1 + -8);
      }
      if (np[local_14]->volume != 0xff) {
        TrackVol[local_14] = (uint)np[local_14]->volume;
      }
      np[local_14] = np[local_14]->to;
    }
    if (np[local_14] != (NOTELIST *)0x0) {
      ChangeDramVolume((long)((TrackVol[local_14] * Volume) / 0x7f),cVar1 + -8);
    }
  }
  PlayPos = PlayPos + 1;
  if ((this->info).end_x <= PlayPos) {
    PlayPos = (this->info).repeat_x;
    SetPlayPointer(this,PlayPos);
  }
  return;
}

Assistant:

void OrgData::PlayData(void)
{
	int i;

	// Handle fading out
	if (bFadeout && Volume)
		Volume -= 2;
	if (Volume < 0)
		Volume = 0;

	// メロディの再生 (Play melody)
	for (i = 0; i < MAXMELODY; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)
		{
			if (!g_mute[i] && np[i]->y != KEYDUMMY)	// 音が来た。 (The sound has come.)
			{
				PlayOrganObject(np[i]->y, -1, i, info.tdata[i].freq);
				now_leng[i] = np[i]->length;
			}

			if (np[i]->pan != PANDUMMY)
				ChangeOrganPan(np[i]->y, np[i]->pan, i);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (now_leng[i] == 0)
			PlayOrganObject(0, 2, i, info.tdata[i].freq);

		if (now_leng[i] > 0)
			now_leng[i]--;

		if (np[i])
			ChangeOrganVolume(np[i]->y, TrackVol[i] * Volume / 0x7F, i);
	}

	// ドラムの再生 (Drum playback)
	for (i = MAXMELODY; i < MAXTRACK; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)	// 音が来た。 (The sound has come.)
		{
			if (np[i]->y != KEYDUMMY && !g_mute[i])	// ならす (Tame)
				PlayDramObject(np[i]->y, 1, i - MAXMELODY);

			if (np[i]->pan != PANDUMMY)
				ChangeDramPan(np[i]->pan, i - MAXMELODY);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (np[i])
			ChangeDramVolume(TrackVol[i] * Volume / 0x7F, i - MAXMELODY);
	}

	// Looping
	PlayPos++;
	if (PlayPos >= info.end_x)
	{
		PlayPos = info.repeat_x;
		SetPlayPointer(PlayPos);
	}
}